

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  ImVec2 *pIVar1;
  ImDrawListSharedData *pIVar2;
  ImVec2 IVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ImVec2 *pIVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int a;
  ImVec2 IVar14;
  ImVec2 IVar15;
  
  if (radius <= 0.0) {
    iVar11 = (this->_Path).Size;
    if (iVar11 == (this->_Path).Capacity) {
      if (iVar11 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar11 / 2 + iVar11;
      }
      iVar10 = iVar11 + 1;
      if (iVar11 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      pIVar8 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar8,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar8;
      (this->_Path).Capacity = iVar10;
      iVar11 = (this->_Path).Size;
    }
    else {
      pIVar8 = (this->_Path).Data;
    }
    pIVar8[iVar11] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    if (a_step < 1) {
      uVar6 = _CalcCircleAutoSegmentCount(this,radius);
      a_step = (int)(0x30 / (ulong)uVar6);
    }
    uVar6 = 0xc;
    if ((uint)a_step < 0xc) {
      uVar6 = a_step;
    }
    uVar13 = 1;
    uVar12 = uVar6;
    if (a_step == 0) {
      uVar12 = 1;
    }
    uVar7 = a_max_sample - a_min_sample;
    uVar4 = -uVar7;
    if (0 < (int)uVar7) {
      uVar4 = uVar7;
    }
    if (uVar12 < 2) {
      iVar11 = uVar4 + 1;
      bVar5 = false;
    }
    else {
      bVar5 = false;
      if (uVar4 % uVar12 == 0) {
        iVar11 = uVar4 / uVar12 + 1;
        uVar13 = uVar6;
      }
      else {
        iVar11 = uVar4 / uVar12 + 2;
        bVar5 = true;
        uVar13 = (int)(char)-((char)((char)uVar12 - (char)(uVar4 % uVar12)) / '\x02') + uVar12;
      }
    }
    iVar9 = (this->_Path).Size;
    iVar11 = iVar11 + iVar9;
    iVar10 = (this->_Path).Capacity;
    if (iVar10 < iVar11) {
      if (iVar10 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar10 / 2 + iVar10;
      }
      if (iVar10 <= iVar11) {
        iVar10 = iVar11;
      }
      pIVar8 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar8,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar8;
      (this->_Path).Capacity = iVar10;
    }
    else {
      pIVar8 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar11;
    iVar11 = a_min_sample;
    if (0x2f < (uint)a_min_sample) {
      iVar11 = ((uint)(a_min_sample / 6 + (a_min_sample >> 0x1f)) >> 3) - (a_min_sample >> 0x1f);
      iVar10 = a_min_sample + iVar11 * -0x30;
      iVar11 = a_min_sample + 0x30 + iVar11 * -0x30;
      if (-1 < iVar10) {
        iVar11 = iVar10;
      }
    }
    pIVar8 = pIVar8 + iVar9;
    pIVar2 = this->_Data;
    if (a_max_sample < a_min_sample) {
      do {
        iVar9 = iVar11 + 0x30;
        if (-1 < iVar11) {
          iVar9 = iVar11;
        }
        IVar14.x = (*center).x + pIVar2->ArcFastVtx[iVar9].x * radius;
        IVar14.y = (*center).y + pIVar2->ArcFastVtx[iVar9].y * radius;
        *pIVar8 = IVar14;
        pIVar8 = pIVar8 + 1;
        a_min_sample = a_min_sample - uVar13;
        iVar11 = iVar9 - uVar13;
        uVar13 = uVar12;
      } while (a_max_sample <= a_min_sample);
    }
    else {
      do {
        iVar9 = iVar11 + -0x30;
        if (iVar11 < 0x30) {
          iVar9 = iVar11;
        }
        IVar15.x = (*center).x + pIVar2->ArcFastVtx[iVar9].x * radius;
        IVar15.y = (*center).y + pIVar2->ArcFastVtx[iVar9].y * radius;
        *pIVar8 = IVar15;
        pIVar8 = pIVar8 + 1;
        a_min_sample = a_min_sample + uVar13;
        iVar11 = iVar9 + uVar13;
        uVar13 = uVar12;
      } while (a_min_sample <= a_max_sample);
    }
    if (bVar5) {
      iVar11 = ((uint)(a_max_sample / 6 + (a_max_sample >> 0x1f)) >> 3) - (a_max_sample >> 0x1f);
      uVar12 = a_max_sample + iVar11 * -0x30;
      uVar6 = a_max_sample + 0x30 + iVar11 * -0x30;
      if (-1 < (int)uVar12) {
        uVar6 = uVar12;
      }
      IVar3.y = radius * pIVar2->ArcFastVtx[uVar6].y + (*center).y;
      IVar3.x = radius * pIVar2->ArcFastVtx[uVar6].x + (*center).x;
      *pIVar8 = IVar3;
    }
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}